

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  TargetType targetType;
  string *args;
  string *name;
  string sStack_c8;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  TargetLinkLanguage(&local_a8,this,config);
  local_58.View_._M_len = local_a8._M_string_length;
  local_58.View_._M_str = local_a8._M_dataplus._M_p;
  local_88.View_._M_len = 1;
  local_88.View_._M_str = "_";
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  args = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&sStack_c8,name);
  cmStrCat<std::__cxx11::string,char[10],std::__cxx11::string,char[2],std::__cxx11::string>
            (__return_storage_ptr__,&local_58,&local_88,args,(char (*) [10])0x5e1499,&sStack_c8,
             (char (*) [2])0x61ec07,config);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_",
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()),
    "_LINKER__",
    cmGlobalNinjaGenerator::EncodeRuleName(
      this->GetGeneratorTarget()->GetName()),
    "_", config);
}